

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::Process::enable_multithreading(bool flag)

{
  index_t iVar1;
  ostream *poVar2;
  void *this;
  ThreadManager *pTVar3;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  bool flag_local;
  
  if (((::(anonymous_namespace)::multithreading_initialized_ & 1) == 0) ||
     ((bool)(::(anonymous_namespace)::multithreading_enabled_ & 1) != flag)) {
    ::(anonymous_namespace)::multithreading_initialized_ = 1;
    ::(anonymous_namespace)::multithreading_enabled_ = flag;
    local_9 = flag;
    if (flag) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"Process",&local_31);
      poVar2 = Logger::out((string *)local_30);
      poVar2 = std::operator<<(poVar2,"Multithreading enabled");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"Available cores = ");
      iVar1 = number_of_cores();
      this = (void *)std::ostream::operator<<(poVar2,iVar1);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      iVar1 = number_of_cores();
      if (iVar1 == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"Process",&local_69);
        poVar2 = Logger::warn((string *)local_68);
        poVar2 = std::operator<<(poVar2,"Processor is not a multicore");
        poVar2 = std::operator<<(poVar2,"(or multithread is not supported)");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
      pTVar3 = SmartPointer::operator_cast_to_ThreadManager_
                         ((SmartPointer *)&::(anonymous_namespace)::thread_manager_);
      if (pTVar3 == (ThreadManager *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"Process",&local_91);
        poVar2 = Logger::warn((string *)local_90);
        poVar2 = std::operator<<(poVar2,"Missing multithreading manager");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Process",&local_b9);
      poVar2 = Logger::out((string *)local_b8);
      poVar2 = std::operator<<(poVar2,"Multithreading disabled");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  return;
}

Assistant:

void enable_multithreading(bool flag) {
            if(
                multithreading_initialized_ &&
                multithreading_enabled_ == flag
            ) {
                return;
            }
            multithreading_initialized_ = true;
            multithreading_enabled_ = flag;
            if(multithreading_enabled_) {
                Logger::out("Process")
                    << "Multithreading enabled" << std::endl
                    << "Available cores = " << number_of_cores()
                    << std::endl;
                // Logger::out("Process")
                //    << "Max. concurrent threads = "
                //    << maximum_concurrent_threads() << std::endl ;
                if(number_of_cores() == 1) {
                    Logger::warn("Process")
                        << "Processor is not a multicore"
			<< "(or multithread is not supported)"
                        << std::endl;
                }
                if(thread_manager_ == nullptr) {
                    Logger::warn("Process")
                        << "Missing multithreading manager"
                        << std::endl;
                }
            } else {
                Logger::out("Process")
                    << "Multithreading disabled" << std::endl;
            }
        }